

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O1

void png_set_keep_unknown_chunks
               (png_structrp png_ptr,int keep,png_const_bytep chunk_list,int num_chunks_in)

{
  int *__dest;
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  char *error_message;
  uint uVar5;
  uint uVar6;
  
  if (png_ptr != (png_structrp)0x0) {
    if (3 < (uint)keep) {
      error_message = "png_set_keep_unknown_chunks: invalid keep";
LAB_0011e016:
      png_app_error(png_ptr,error_message);
      return;
    }
    if ((0 < num_chunks_in) || (png_ptr->unknown_default = keep, num_chunks_in != 0)) {
      if (num_chunks_in < 0) {
        num_chunks_in = 0x12;
        chunk_list = "bKGD";
      }
      else if (chunk_list == (png_const_bytep)0x0) {
        error_message = "png_set_keep_unknown_chunks: no chunk list";
        goto LAB_0011e016;
      }
      __dest = (int *)png_ptr->chunk_list;
      uVar6 = 0;
      if (__dest != (int *)0x0) {
        uVar6 = png_ptr->num_chunk_list;
      }
      if (0x33333333 < num_chunks_in + uVar6) {
        error_message = "png_set_keep_unknown_chunks: too many chunks";
        goto LAB_0011e016;
      }
      if (keep == 0) {
        if (uVar6 == 0) {
          __dest = (int *)0x0;
        }
      }
      else {
        __dest = (int *)png_malloc(png_ptr,(ulong)((num_chunks_in + uVar6) * 5));
        if (uVar6 != 0) {
          memcpy(__dest,png_ptr->chunk_list,(ulong)(uVar6 * 5));
        }
      }
      if (__dest == (int *)0x0) {
        __dest = (int *)0x0;
        uVar4 = 0;
      }
      else {
        if (num_chunks_in != 0) {
          uVar2 = 0;
          do {
            uVar4 = (int)uVar2 * 5;
            piVar3 = __dest;
            for (uVar5 = uVar6; uVar5 != 0; uVar5 = uVar5 - 1) {
              if (*piVar3 == *(int *)(chunk_list + uVar4)) goto LAB_0011e0a4;
              piVar3 = (int *)((long)piVar3 + 5);
            }
            if (keep != 0) {
              uVar6 = uVar6 + 1;
              *piVar3 = *(int *)(chunk_list + uVar4);
LAB_0011e0a4:
              *(char *)(piVar3 + 1) = (char)keep;
            }
            uVar2 = uVar2 + 1;
          } while (uVar2 != (uint)num_chunks_in);
        }
        uVar4 = 0;
        piVar3 = __dest;
        piVar1 = __dest;
        for (; uVar6 != 0; uVar6 = uVar6 - 1) {
          if ((char)piVar3[1] != '\0') {
            if (piVar3 != piVar1) {
              *(char *)(piVar1 + 1) = (char)piVar3[1];
              *piVar1 = *piVar3;
            }
            piVar1 = (int *)((long)piVar1 + 5);
            uVar4 = uVar4 + 1;
          }
          piVar3 = (int *)((long)piVar3 + 5);
        }
        if (uVar4 == 0) {
          if ((int *)png_ptr->chunk_list != __dest) {
            png_free(png_ptr,__dest);
          }
          __dest = (int *)0x0;
        }
      }
      png_ptr->num_chunk_list = uVar4;
      piVar3 = (int *)png_ptr->chunk_list;
      if (piVar3 != __dest) {
        if (piVar3 != (int *)0x0) {
          png_free(png_ptr,piVar3);
        }
        png_ptr->chunk_list = (png_bytep)__dest;
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_keep_unknown_chunks(png_structrp png_ptr, int keep,
    png_const_bytep chunk_list, int num_chunks_in)
{
   png_bytep new_list;
   unsigned int num_chunks, old_num_chunks;

   if (png_ptr == NULL)
      return;

   if (keep < 0 || keep >= PNG_HANDLE_CHUNK_LAST)
   {
      png_app_error(png_ptr, "png_set_keep_unknown_chunks: invalid keep");

      return;
   }

   if (num_chunks_in <= 0)
   {
      png_ptr->unknown_default = keep;

      /* '0' means just set the flags, so stop here */
      if (num_chunks_in == 0)
        return;
   }

   if (num_chunks_in < 0)
   {
      /* Ignore all unknown chunks and all chunks recognized by
       * libpng except for IHDR, PLTE, tRNS, IDAT, and IEND
       */
      static const png_byte chunks_to_ignore[] = {
         98,  75,  71,  68, '\0',  /* bKGD */
         99,  72,  82,  77, '\0',  /* cHRM */
        101,  88,  73, 102, '\0',  /* eXIf */
        103,  65,  77,  65, '\0',  /* gAMA */
        104,  73,  83,  84, '\0',  /* hIST */
        105,  67,  67,  80, '\0',  /* iCCP */
        105,  84,  88, 116, '\0',  /* iTXt */
        111,  70,  70, 115, '\0',  /* oFFs */
        112,  67,  65,  76, '\0',  /* pCAL */
        112,  72,  89, 115, '\0',  /* pHYs */
        115,  66,  73,  84, '\0',  /* sBIT */
        115,  67,  65,  76, '\0',  /* sCAL */
        115,  80,  76,  84, '\0',  /* sPLT */
        115,  84,  69,  82, '\0',  /* sTER */
        115,  82,  71,  66, '\0',  /* sRGB */
        116,  69,  88, 116, '\0',  /* tEXt */
        116,  73,  77,  69, '\0',  /* tIME */
        122,  84,  88, 116, '\0'   /* zTXt */
      };

      chunk_list = chunks_to_ignore;
      num_chunks = (unsigned int)/*SAFE*/(sizeof chunks_to_ignore)/5U;
   }

   else /* num_chunks_in > 0 */
   {
      if (chunk_list == NULL)
      {
         /* Prior to 1.6.0 this was silently ignored, now it is an app_error
          * which can be switched off.
          */
         png_app_error(png_ptr, "png_set_keep_unknown_chunks: no chunk list");

         return;
      }

      num_chunks = (unsigned int)num_chunks_in;
   }

   old_num_chunks = png_ptr->num_chunk_list;
   if (png_ptr->chunk_list == NULL)
      old_num_chunks = 0;

   /* Since num_chunks is always restricted to UINT_MAX/5 this can't overflow.
    */
   if (num_chunks + old_num_chunks > UINT_MAX/5)
   {
      png_app_error(png_ptr, "png_set_keep_unknown_chunks: too many chunks");

      return;
   }

   /* If these chunks are being reset to the default then no more memory is
    * required because add_one_chunk above doesn't extend the list if the 'keep'
    * parameter is the default.
    */
   if (keep != 0)
   {
      new_list = png_voidcast(png_bytep, png_malloc(png_ptr,
          5 * (num_chunks + old_num_chunks)));

      if (old_num_chunks > 0)
         memcpy(new_list, png_ptr->chunk_list, 5*old_num_chunks);
   }

   else if (old_num_chunks > 0)
      new_list = png_ptr->chunk_list;

   else
      new_list = NULL;

   /* Add the new chunks together with each one's handling code.  If the chunk
    * already exists the code is updated, otherwise the chunk is added to the
    * end.  (In libpng 1.6.0 order no longer matters because this code enforces
    * the earlier convention that the last setting is the one that is used.)
    */
   if (new_list != NULL)
   {
      png_const_bytep inlist;
      png_bytep outlist;
      unsigned int i;

      for (i=0; i<num_chunks; ++i)
      {
         old_num_chunks = add_one_chunk(new_list, old_num_chunks,
             chunk_list+5*i, keep);
      }

      /* Now remove any spurious 'default' entries. */
      num_chunks = 0;
      for (i=0, inlist=outlist=new_list; i<old_num_chunks; ++i, inlist += 5)
      {
         if (inlist[4])
         {
            if (outlist != inlist)
               memcpy(outlist, inlist, 5);
            outlist += 5;
            ++num_chunks;
         }
      }

      /* This means the application has removed all the specialized handling. */
      if (num_chunks == 0)
      {
         if (png_ptr->chunk_list != new_list)
            png_free(png_ptr, new_list);

         new_list = NULL;
      }
   }

   else
      num_chunks = 0;

   png_ptr->num_chunk_list = num_chunks;

   if (png_ptr->chunk_list != new_list)
   {
      if (png_ptr->chunk_list != NULL)
         png_free(png_ptr, png_ptr->chunk_list);

      png_ptr->chunk_list = new_list;
   }
}